

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

void __thiscall Uniforms::addDefine(Uniforms *this,string *_define,string *_value)

{
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->super_Scene).models._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    vera::Model::addDefine(*(Model **)(p_Var1 + 2),_define,_value);
  }
  return;
}

Assistant:

void Uniforms::addDefine(const std::string& _define, const std::string& _value) {
    for (vera::ModelsMap::iterator it = models.begin(); it != models.end(); ++it)
        it->second->addDefine(_define, _value);
}